

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall
loader::Logger::Logger
          (Logger *this,string *logger_name,Console out,string *log_level,bool logging_enabled_env,
          string *format)

{
  ulong uVar1;
  element_type *this_00;
  string local_d0 [32];
  string local_b0 [40];
  spdlog_ex *exception;
  undefined1 local_78 [8];
  shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_> sink_1;
  undefined1 local_48 [8];
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> sink;
  string *format_local;
  bool logging_enabled_env_local;
  string *log_level_local;
  Console out_local;
  string *logger_name_local;
  Logger *this_local;
  
  this->log_to_console = true;
  this->logging_enabled = false;
  sink.
  super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)format;
  std::shared_ptr<spdlog::logger>::shared_ptr(&this->_logger,(nullptr_t)0x0);
  if (logging_enabled_env) {
    this->logging_enabled = logging_enabled_env;
    if (out == out_stdout) {
      std::make_shared<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>();
      std::
      make_shared<spdlog::logger,std::__cxx11::string&,std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sink_1.
                  super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_>
                  *)logger_name);
      std::shared_ptr<spdlog::logger>::operator=
                (&this->_logger,
                 (shared_ptr<spdlog::logger> *)
                 &sink_1.
                  super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::shared_ptr<spdlog::logger>::~shared_ptr
                ((shared_ptr<spdlog::logger> *)
                 &sink_1.
                  super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_>::
      ~shared_ptr((shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_>
                   *)local_48);
    }
    else {
      if (out != out_stderr) {
        std::operator<<((ostream *)&std::cerr,"Invalid console output specified\n");
        this->logging_enabled = false;
        return;
      }
      std::make_shared<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>>();
      std::
      make_shared<spdlog::logger,std::__cxx11::string&,std::shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exception,
                 (shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_>
                  *)logger_name);
      std::shared_ptr<spdlog::logger>::operator=
                (&this->_logger,(shared_ptr<spdlog::logger> *)&exception);
      std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)&exception);
      std::shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_>::
      ~shared_ptr((shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_>
                   *)local_78);
    }
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->_logger);
      std::__cxx11::string::string(local_b0,(string *)format);
      spdlog::logger::set_pattern(this_00,(string *)local_b0,local);
      std::__cxx11::string::~string(local_b0);
    }
    std::__cxx11::string::string(local_d0,(string *)log_level);
    setLogLevel(this,(string *)local_d0);
    std::__cxx11::string::~string(local_d0);
  }
  return;
}

Assistant:

Logger(std::string logger_name, Console out, std::string log_level, bool logging_enabled_env, std::string format = "") {
    if (logging_enabled_env) {
      logging_enabled = logging_enabled_env;
      try {
        if (out == Console::out_stdout) {
          auto sink = std::make_shared<spdlog::sinks::ansicolor_stdout_sink_mt>();
          _logger = std::make_shared<spdlog::logger>(logger_name, std::move(sink));
        } else if (out == Console::out_stderr) {
          auto sink = std::make_shared<spdlog::sinks::ansicolor_stderr_sink_mt>();
          _logger = std::make_shared<spdlog::logger>(logger_name, std::move(sink));
        } else {
          std::cerr << "Invalid console output specified\n";
          logging_enabled = false;
          return;
        }
      } catch (spdlog::spdlog_ex &exception) {
        std::cerr << "Unable to create log stdout logger " << exception.what() << "\n";
        logging_enabled = false;
        return;
      }

      if (!format.empty()) {
        _logger->set_pattern(format);
      }

      setLogLevel(log_level);
    }
  }